

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::gettime(uint argc)

{
  unsigned_long uVar1;
  int in_EDI;
  unsigned_long t;
  int typ;
  time_t in_stack_00000050;
  uint in_stack_ffffffffffffffec;
  undefined8 in_stack_fffffffffffffff0;
  undefined4 local_8;
  
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_fffffffffffffff0 >> 0x20),(uint)in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec);
  if (in_EDI == 1) {
    local_8 = CVmBif::pop_int_val();
  }
  else {
    local_8 = 1;
  }
  if (local_8 == 1) {
    time((time_t *)0x0);
    format_datetime_list(in_stack_00000050);
    CVmBif::retval_obj(0);
  }
  else {
    if (local_8 != 2) {
      err_throw(0);
    }
    uVar1 = os_get_sys_clock_ms();
    if (gettime::t_zero_set == 0) {
      gettime::t_zero_set = 1;
      gettime::t_zero = uVar1;
    }
    CVmBif::retval_int(0x2f8e2d);
  }
  return;
}

Assistant:

void CVmBifTADS::gettime(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's an argument, get the type of time value to return */
    int typ;
    if (argc == 1)
    {
        /* get the time type code */
        typ = pop_int_val(vmg0_);
    }
    else
    {
        /* use the default type */
        typ = 1;
    }